

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O1

void __thiscall QFileSystemModel::timerEvent(QFileSystemModel *this,QTimerEvent *event)

{
  long lVar1;
  long lVar2;
  QFileInfoGatherer *this_00;
  ulong uVar3;
  long lVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  if (*(int *)(event + 0x10) == *(int *)(lVar1 + 0x1a0)) {
    QBasicTimer::stop();
    if (*(long *)(lVar1 + 0x198) != 0) {
      lVar4 = 0x18;
      uVar3 = 0;
      do {
        lVar2 = *(long *)(lVar1 + 400);
        if (*(long *)(*(long *)(lVar2 + 0x18 + lVar4) + 0x38) == 0) {
          this_00 = *(QFileInfoGatherer **)(lVar1 + 0xe0);
          local_58.d = (Data *)0x0;
          local_58.ptr = (QString *)0x0;
          local_58.size = 0;
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)&local_58,0,(QString *)(lVar2 + lVar4));
          QList<QString>::end((QList<QString> *)&local_58);
          QFileInfoGatherer::fetchExtendedInformation
                    (this_00,(QString *)(lVar2 + lVar4 + -0x18),(QStringList *)&local_58);
          QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
        }
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 0x38;
      } while (uVar3 < *(ulong *)(lVar1 + 0x198));
    }
    QList<QFileSystemModelPrivate::Fetching>::clear
              ((QList<QFileSystemModelPrivate::Fetching> *)(lVar1 + 0x188));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileSystemModel::timerEvent(QTimerEvent *event)
{
    Q_D(QFileSystemModel);
    if (event->timerId() == d->fetchingTimer.timerId()) {
        d->fetchingTimer.stop();
#if QT_CONFIG(filesystemwatcher)
        for (int i = 0; i < d->toFetch.size(); ++i) {
            const QFileSystemModelPrivate::QFileSystemNode *node = d->toFetch.at(i).node;
            if (!node->hasInformation()) {
                d->fileInfoGatherer->fetchExtendedInformation(d->toFetch.at(i).dir,
                                                 QStringList(d->toFetch.at(i).file));
            } else {
                // qDebug("yah!, you saved a little gerbil soul");
            }
        }
#endif
        d->toFetch.clear();
    }
}